

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode singlesocket(Curl_multi *multi,Curl_easy *data)

{
  int *piVar1;
  Curl_easy *pCVar2;
  Curl_multi *pCVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  Curl_hash *pCVar7;
  void *pvVar8;
  ulong uVar9;
  size_t key_len;
  ulong uVar10;
  ulong uVar11;
  Curl_easy **key;
  byte bVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  bool bVar16;
  uchar actions [5];
  curl_socket_t socks [5];
  int local_7c;
  CURLMcode local_78;
  uint local_74;
  Curl_easy *local_70;
  Curl_hash *local_68;
  Curl_multi *local_60;
  int local_54;
  byte local_4d [5];
  curl_socket_t local_48 [6];
  
  local_48[0] = -1;
  local_48[1] = 0xffffffff;
  local_48[2] = 0xffffffff;
  local_48[3] = 0xffffffff;
  local_48[4] = 0xffffffff;
  local_70 = data;
  local_60 = multi;
  local_74 = multi_getsock(data,local_48);
  local_68 = &multi->sockhash;
  uVar10 = 0;
  do {
    bVar12 = (byte)uVar10;
    uVar13 = 0x10000 << (bVar12 & 0x1f);
    if ((local_74 >> (bVar12 & 0x1f) & 0x10001) == 0) goto LAB_005a800c;
    iVar5 = local_48[uVar10];
    local_7c = iVar5;
    if (iVar5 == -1) {
      pCVar7 = (Curl_hash *)0x0;
    }
    else {
      pCVar7 = (Curl_hash *)Curl_hash_pick(local_68,&local_7c,4);
    }
    bVar16 = (1 << (bVar12 & 0x1f) & local_74) != 0;
    bVar12 = bVar16 + 2;
    if ((uVar13 & local_74) == 0) {
      bVar12 = bVar16;
    }
    local_4d[uVar10] = bVar12;
    if (pCVar7 == (Curl_hash *)0x0) {
      local_54 = iVar5;
      if (iVar5 == -1) {
        pCVar7 = (Curl_hash *)0x0;
        local_7c = iVar5;
      }
      else {
        local_7c = iVar5;
        pCVar7 = (Curl_hash *)Curl_hash_pick(local_68,&local_7c,4);
      }
      if (pCVar7 == (Curl_hash *)0x0) {
        pCVar7 = (Curl_hash *)(*Curl_ccalloc)(1,0x48);
        if (pCVar7 != (Curl_hash *)0x0) {
          Curl_hash_init(pCVar7,0xd,trhash,trhash_compare,trhash_dtor);
          pvVar8 = Curl_hash_add(local_68,&local_54,4,pCVar7);
          if (pvVar8 != (void *)0x0) goto LAB_005a7ed7;
          Curl_hash_destroy(pCVar7);
          (*Curl_cfree)(pCVar7);
        }
        pCVar7 = (Curl_hash *)0x0;
      }
LAB_005a7ed7:
      bVar4 = 0;
      bVar16 = false;
      if (pCVar7 != (Curl_hash *)0x0) goto LAB_005a7ee4;
LAB_005a7f36:
      local_78 = CURLM_OUT_OF_MEMORY;
LAB_005a7fe8:
      iVar6 = 1;
    }
    else {
      uVar9 = (ulong)local_70->numsocks;
      bVar4 = 0;
      bVar16 = 0 < (long)uVar9;
      if (0 < (long)uVar9) {
        uVar11 = 0;
        do {
          if (iVar5 == local_70->sockets[uVar11]) {
            bVar4 = local_70->actions[uVar11];
            bVar16 = true;
            goto LAB_005a7ee4;
          }
          uVar11 = uVar11 + 1;
        } while (uVar9 != uVar11);
        bVar16 = uVar11 < uVar9;
      }
LAB_005a7ee4:
      if (bVar16) {
        if (bVar4 == bVar12) {
          if (!bVar16) goto LAB_005a7ef6;
        }
        else {
          if ((bVar4 & 1) != 0) {
            *(int *)&pCVar7[1].comp_func = *(int *)&pCVar7[1].comp_func + -1;
          }
          if ((bVar4 & 2) != 0) {
            piVar1 = (int *)((long)&pCVar7[1].comp_func + 4);
            *piVar1 = *piVar1 + -1;
          }
          if ((bVar12 & 1) != 0) {
            *(int *)&pCVar7[1].comp_func = *(int *)&pCVar7[1].comp_func + 1;
          }
          if ((local_74 & uVar13) != 0) {
            piVar1 = (int *)((long)&pCVar7[1].comp_func + 4);
            *piVar1 = *piVar1 + 1;
          }
        }
      }
      else {
LAB_005a7ef6:
        piVar1 = (int *)((long)&pCVar7[1].table + 4);
        *piVar1 = *piVar1 + 1;
        if ((bVar12 & 1) != 0) {
          *(int *)&pCVar7[1].comp_func = *(int *)&pCVar7[1].comp_func + 1;
        }
        if ((local_74 & uVar13) != 0) {
          piVar1 = (int *)((long)&pCVar7[1].comp_func + 4);
          *piVar1 = *piVar1 + 1;
        }
        pvVar8 = Curl_hash_add(pCVar7,&local_70,8,local_70);
        if (pvVar8 == (void *)0x0) {
          Curl_hash_destroy(pCVar7);
          goto LAB_005a7f36;
        }
      }
      pCVar3 = local_60;
      iVar14 = (uint)(*(int *)&pCVar7[1].comp_func != 0) +
               (uint)(*(int *)((long)&pCVar7[1].comp_func + 4) != 0) * 2;
      if ((!bVar16) || (iVar6 = 7, *(int *)&pCVar7[1].table != iVar14)) {
        if (local_60->socket_cb != (curl_socket_callback)0x0) {
          local_60->in_callback = true;
          iVar5 = (*local_60->socket_cb)
                            (local_70,iVar5,iVar14,local_60->socket_userp,pCVar7[1].hash_func);
          pCVar3->in_callback = false;
          if (iVar5 == -1) {
            pCVar3->dead = true;
            local_78 = CURLM_ABORTED_BY_CALLBACK;
            goto LAB_005a7fe8;
          }
        }
        *(int *)&pCVar7[1].table = iVar14;
        iVar6 = 0;
      }
    }
    if ((iVar6 != 7) && (iVar6 != 0)) {
      return local_78;
    }
    uVar10 = uVar10 + 1;
  } while (uVar10 != 5);
  uVar10 = 5;
LAB_005a800c:
  uVar9 = uVar10 & 0xffffffff;
  if (0 < local_70->numsocks) {
    lVar15 = 0;
    do {
      iVar5 = local_70->sockets[lVar15];
      if ((int)uVar10 != 0) {
        uVar11 = 0;
        do {
          if (iVar5 == local_48[uVar11]) {
            iVar14 = 0xd;
            goto LAB_005a8116;
          }
          uVar11 = uVar11 + 1;
        } while (uVar9 != uVar11);
      }
      local_7c = iVar5;
      if (iVar5 == -1) {
        pCVar7 = (Curl_hash *)0x0;
      }
      else {
        pCVar7 = (Curl_hash *)Curl_hash_pick(local_68,&local_7c,4);
      }
      iVar14 = 0;
      if (pCVar7 != (Curl_hash *)0x0) {
        bVar12 = local_70->actions[lVar15];
        iVar6 = *(int *)((long)&pCVar7[1].table + 4) + -1;
        *(int *)((long)&pCVar7[1].table + 4) = iVar6;
        if ((bVar12 & 2) != 0) {
          piVar1 = (int *)((long)&pCVar7[1].comp_func + 4);
          *piVar1 = *piVar1 + -1;
        }
        if ((bVar12 & 1) != 0) {
          *(int *)&pCVar7[1].comp_func = *(int *)&pCVar7[1].comp_func + -1;
        }
        if (iVar6 == 0) {
          if (local_60->socket_cb != (curl_socket_callback)0x0) {
            local_60->in_callback = true;
            iVar6 = (*local_60->socket_cb)
                              (local_70,iVar5,4,local_60->socket_userp,pCVar7[1].hash_func);
            local_60->in_callback = false;
            if (iVar6 == -1) {
              local_60->dead = true;
              local_78 = CURLM_ABORTED_BY_CALLBACK;
              iVar14 = 1;
              goto LAB_005a8116;
            }
          }
          local_7c = iVar5;
          Curl_hash_destroy(pCVar7);
          key_len = 4;
          key = (Curl_easy **)&local_7c;
          pCVar7 = local_68;
        }
        else {
          key_len = 8;
          key = &local_70;
        }
        Curl_hash_delete(pCVar7,key,key_len);
      }
LAB_005a8116:
      if ((iVar14 != 0xd) && (iVar14 != 0)) {
        return local_78;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < local_70->numsocks);
  }
  pCVar2 = local_70;
  memcpy(local_70->sockets,local_48,uVar9 * 4);
  memcpy(pCVar2->actions,local_4d,uVar9);
  pCVar2->numsocks = (int)uVar10;
  return CURLM_OK;
}

Assistant:

static CURLMcode singlesocket(struct Curl_multi *multi,
                              struct Curl_easy *data)
{
  curl_socket_t socks[MAX_SOCKSPEREASYHANDLE];
  int i;
  struct Curl_sh_entry *entry;
  curl_socket_t s;
  int num;
  unsigned int curraction;
  unsigned char actions[MAX_SOCKSPEREASYHANDLE];
  int rc;

  for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++)
    socks[i] = CURL_SOCKET_BAD;

  /* Fill in the 'current' struct with the state as it is now: what sockets to
     supervise and for what actions */
  curraction = multi_getsock(data, socks);

  /* We have 0 .. N sockets already and we get to know about the 0 .. M
     sockets we should have from now on. Detect the differences, remove no
     longer supervised ones and add new ones */

  /* walk over the sockets we got right now */
  for(i = 0; (i< MAX_SOCKSPEREASYHANDLE) &&
        (curraction & (GETSOCK_READSOCK(i) | GETSOCK_WRITESOCK(i)));
      i++) {
    unsigned char action = CURL_POLL_NONE;
    unsigned char prevaction = 0;
    int comboaction;
    bool sincebefore = FALSE;

    s = socks[i];

    /* get it from the hash */
    entry = sh_getentry(&multi->sockhash, s);

    if(curraction & GETSOCK_READSOCK(i))
      action |= CURL_POLL_IN;
    if(curraction & GETSOCK_WRITESOCK(i))
      action |= CURL_POLL_OUT;

    actions[i] = action;
    if(entry) {
      /* check if new for this transfer */
      int j;
      for(j = 0; j< data->numsocks; j++) {
        if(s == data->sockets[j]) {
          prevaction = data->actions[j];
          sincebefore = TRUE;
          break;
        }
      }
    }
    else {
      /* this is a socket we didn't have before, add it to the hash! */
      entry = sh_addentry(&multi->sockhash, s);
      if(!entry)
        /* fatal */
        return CURLM_OUT_OF_MEMORY;
    }
    if(sincebefore && (prevaction != action)) {
      /* Socket was used already, but different action now */
      if(prevaction & CURL_POLL_IN)
        entry->readers--;
      if(prevaction & CURL_POLL_OUT)
        entry->writers--;
      if(action & CURL_POLL_IN)
        entry->readers++;
      if(action & CURL_POLL_OUT)
        entry->writers++;
    }
    else if(!sincebefore) {
      /* a new user */
      entry->users++;
      if(action & CURL_POLL_IN)
        entry->readers++;
      if(action & CURL_POLL_OUT)
        entry->writers++;

      /* add 'data' to the transfer hash on this socket! */
      if(!Curl_hash_add(&entry->transfers, (char *)&data, /* hash key */
                        sizeof(struct Curl_easy *), data)) {
        Curl_hash_destroy(&entry->transfers);
        return CURLM_OUT_OF_MEMORY;
      }
    }

    comboaction = (entry->writers? CURL_POLL_OUT : 0) |
                   (entry->readers ? CURL_POLL_IN : 0);

    /* socket existed before and has the same action set as before */
    if(sincebefore && ((int)entry->action == comboaction))
      /* same, continue */
      continue;

    if(multi->socket_cb) {
      set_in_callback(multi, TRUE);
      rc = multi->socket_cb(data, s, comboaction, multi->socket_userp,
                            entry->socketp);
      set_in_callback(multi, FALSE);
      if(rc == -1) {
        multi->dead = TRUE;
        return CURLM_ABORTED_BY_CALLBACK;
      }
    }

    entry->action = comboaction; /* store the current action state */
  }

  num = i; /* number of sockets */

  /* when we've walked over all the sockets we should have right now, we must
     make sure to detect sockets that are removed */
  for(i = 0; i< data->numsocks; i++) {
    int j;
    bool stillused = FALSE;
    s = data->sockets[i];
    for(j = 0; j < num; j++) {
      if(s == socks[j]) {
        /* this is still supervised */
        stillused = TRUE;
        break;
      }
    }
    if(stillused)
      continue;

    entry = sh_getentry(&multi->sockhash, s);
    /* if this is NULL here, the socket has been closed and notified so
       already by Curl_multi_closed() */
    if(entry) {
      unsigned char oldactions = data->actions[i];
      /* this socket has been removed. Decrease user count */
      entry->users--;
      if(oldactions & CURL_POLL_OUT)
        entry->writers--;
      if(oldactions & CURL_POLL_IN)
        entry->readers--;
      if(!entry->users) {
        if(multi->socket_cb) {
          set_in_callback(multi, TRUE);
          rc = multi->socket_cb(data, s, CURL_POLL_REMOVE,
                                multi->socket_userp, entry->socketp);
          set_in_callback(multi, FALSE);
          if(rc == -1) {
            multi->dead = TRUE;
            return CURLM_ABORTED_BY_CALLBACK;
          }
        }
        sh_delentry(entry, &multi->sockhash, s);
      }
      else {
        /* still users, but remove this handle as a user of this socket */
        if(Curl_hash_delete(&entry->transfers, (char *)&data,
                            sizeof(struct Curl_easy *))) {
          DEBUGASSERT(NULL);
        }
      }
    }
  } /* for loop over numsocks */

  memcpy(data->sockets, socks, num*sizeof(curl_socket_t));
  memcpy(data->actions, actions, num*sizeof(char));
  data->numsocks = num;
  return CURLM_OK;
}